

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool GGUFMeta::GKV<bool>::set(gguf_context *ctx,int k,bool *target,llama_model_kv_override *ovrd)

{
  type_conflict1 tVar1;
  bool bVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 in_RDX;
  int in_ESI;
  int in_stack_0000002c;
  gguf_context *in_stack_00000030;
  undefined1 local_1;
  
  tVar1 = try_override<bool>((bool *)CONCAT71(in_register_00000009,in_CL),
                             (llama_model_kv_override *)0x45f8b4);
  if (tVar1) {
    local_1 = true;
  }
  else if (in_ESI < 0) {
    local_1 = false;
  }
  else {
    bVar2 = get_kv(in_stack_00000030,in_stack_0000002c);
    *(bool *)in_RDX = bVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool set(const gguf_context * ctx, const int k, T & target, const struct llama_model_kv_override * ovrd = nullptr) {
            if (try_override<T>(target, ovrd)) {
                return true;
            }
            if (k < 0) { return false; }
            target = get_kv(ctx, k);
            return true;
        }